

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

int ncnn_extractor_extract_index(ncnn_extractor_t ex,int index,ncnn_mat_t *mat)

{
  int iVar1;
  void *pvVar2;
  undefined8 *in_RDX;
  int ret;
  Mat mat0;
  int in_stack_000000d4;
  Mat *in_stack_000000d8;
  int in_stack_000000e4;
  Extractor *in_stack_000000e8;
  Mat *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Mat local_60;
  undefined8 *local_18;
  
  local_18 = in_RDX;
  ncnn::Mat::Mat(&local_60);
  iVar1 = ncnn::Extractor::extract
                    (in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,in_stack_000000d4);
  pvVar2 = operator_new(0x48);
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
  *local_18 = pvVar2;
  ncnn::Mat::~Mat((Mat *)0x147baa);
  return iVar1;
}

Assistant:

int ncnn_extractor_extract_index(ncnn_extractor_t ex, int index, ncnn_mat_t* mat)
{
    Mat mat0;
    int ret = ((Extractor*)ex)->extract(index, mat0);
    *mat = (ncnn_mat_t)(new Mat(mat0));
    return ret;
}